

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

void check_less<char[1],booster::sub_match<char_const*>>(char (*a) [1],sub_match<const_char_*> b)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  sub_match<const_char_*> *in_stack_ffffffffffffea18;
  sub_match<const_char_*> *in_stack_ffffffffffffea20;
  string local_1390 [32];
  ostringstream local_1370 [383];
  undefined1 local_11f1;
  string local_11f0 [32];
  ostringstream local_11d0 [383];
  undefined1 local_1051;
  string local_1050 [32];
  ostringstream local_1030 [383];
  undefined1 local_eb1;
  string local_eb0 [32];
  ostringstream local_e90 [383];
  undefined1 local_d11;
  string local_d10 [32];
  ostringstream local_cf0 [383];
  undefined1 local_b71;
  string local_b70 [32];
  ostringstream local_b50 [383];
  undefined1 local_9d1;
  string local_9d0 [32];
  ostringstream local_9b0 [383];
  undefined1 local_831;
  string local_830 [32];
  ostringstream local_810 [383];
  undefined1 local_691;
  string local_690 [32];
  ostringstream local_670 [383];
  undefined1 local_4f1;
  string local_4f0 [32];
  ostringstream local_4d0 [383];
  undefined1 local_351;
  string local_350 [32];
  ostringstream local_330 [383];
  undefined1 local_1b1;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  bVar1 = booster::operator<((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    poVar2 = std::operator<<((ostream *)local_180,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    std::operator<<(poVar2," a<b");
    local_1b1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    local_1b1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_330);
    poVar2 = std::operator<<((ostream *)local_330,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
    std::operator<<(poVar2," a<=b");
    local_351 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_350);
    local_351 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4d0);
    poVar2 = std::operator<<((ostream *)local_4d0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
    std::operator<<(poVar2," !(a>b)");
    local_4f1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4f0);
    local_4f1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_670);
    poVar2 = std::operator<<((ostream *)local_670,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
    std::operator<<(poVar2," !(a>=b)");
    local_691 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_690);
    local_691 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_810);
    poVar2 = std::operator<<((ostream *)local_810,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," b>a");
    local_831 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_830);
    local_831 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_9b0);
    poVar2 = std::operator<<((ostream *)local_9b0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::operator<<(poVar2," b>=a");
    local_9d1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_9d0);
    local_9d1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_b50);
    poVar2 = std::operator<<((ostream *)local_b50,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x34);
    std::operator<<(poVar2," !(b<a)");
    local_b71 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_b70);
    local_b71 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (!bVar1) {
    bVar1 = booster::operator!=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_e90);
      poVar2 = std::operator<<((ostream *)local_e90,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
      std::operator<<(poVar2," a!=b");
      local_eb1 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_eb0);
      local_eb1 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator!=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1030);
      poVar2 = std::operator<<((ostream *)local_1030,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::operator<<(poVar2," b!=a");
      local_1051 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_1050);
      local_1051 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_11d0);
      poVar2 = std::operator<<((ostream *)local_11d0,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
      std::operator<<(poVar2," !(a==b)");
      local_11f1 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_11f0);
      local_11f1 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
    if (!bVar1) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1370);
    poVar2 = std::operator<<((ostream *)local_1370,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x39);
    std::operator<<(poVar2," !(b==a)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1390);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_cf0);
  poVar2 = std::operator<<((ostream *)local_cf0,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
  std::operator<<(poVar2," !(b<=a)");
  local_d11 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_d10);
  local_d11 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_less(Match const &a,Other b)
{
	TEST(a<b);
	TEST(a<=b);
	TEST(!(a>b));
	TEST(!(a>=b));
	TEST(b>a);
	TEST(b>=a);
	TEST(!(b<a));
	TEST(!(b<=a));
	TEST(a!=b);
	TEST(b!=a);
	TEST(!(a==b));
	TEST(!(b==a));
}